

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
google::protobuf::compiler::cpp::MessageVars_abi_cxx11_
          (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cpp *this,Descriptor *desc)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  long lVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  allocator_type local_613;
  key_equal local_612;
  hasher local_611;
  undefined1 local_610 [32];
  undefined1 local_5f0 [32];
  undefined1 local_5d0 [32];
  undefined1 local_5b0 [32];
  undefined1 local_590 [32];
  undefined1 local_570 [32];
  undefined1 local_550 [32];
  undefined1 local_530 [40];
  char *local_508;
  char *local_500;
  char *local_4f8;
  char local_4f0 [8];
  char acStack_4e8 [8];
  undefined8 local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  undefined1 local_4c0 [8];
  char acStack_4b8 [8];
  undefined8 local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  undefined1 local_490 [8];
  char acStack_488 [8];
  undefined8 local_480;
  char *local_478;
  undefined1 *local_470;
  char *local_468;
  undefined1 local_460 [8];
  char acStack_458 [8];
  undefined8 local_450;
  char *local_448;
  undefined1 *local_440;
  char *local_438;
  undefined1 local_430 [8];
  char acStack_428 [8];
  undefined8 local_420;
  char *local_418;
  undefined1 *local_410;
  char *local_408;
  undefined1 local_400 [8];
  char acStack_3f8 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  undefined8 local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  undefined1 local_3a0 [8];
  char acStack_398 [8];
  undefined8 local_390;
  char *local_388;
  undefined1 *local_380;
  char *local_378;
  undefined1 local_370 [8];
  char acStack_368 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_360;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  AlphaNum local_300;
  undefined8 local_2d0;
  char *local_2c8;
  AlphaNum local_2a0;
  undefined8 local_270;
  char *local_268;
  AlphaNum local_240;
  undefined8 local_210;
  char *local_208;
  AlphaNum local_1e0;
  undefined8 local_1b0;
  char *local_1a8;
  AlphaNum local_180;
  undefined8 local_150;
  char *local_148;
  AlphaNum local_120;
  undefined8 local_f0;
  char *local_e8;
  AlphaNum local_c0;
  undefined8 local_90;
  char *local_88;
  AlphaNum local_60;
  
  local_60.piece_._M_len = 7;
  local_60.piece_._M_str = "_impl_.";
  local_90 = 0xe;
  local_88 = "_any_metadata_";
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_5b0,&local_60);
  local_500 = local_4f0;
  local_530[0x20] = '\f';
  local_530[0x21] = '\0';
  local_530[0x22] = '\0';
  local_530[0x23] = '\0';
  local_530[0x24] = '\0';
  local_530[0x25] = '\0';
  local_530[0x26] = '\0';
  local_530[0x27] = '\0';
  local_508 = "any_metadata";
  if ((undefined1 *)local_5b0._0_8_ == local_5b0 + 0x10) {
    acStack_4e8[0] = local_5b0[0x18];
    acStack_4e8[1] = local_5b0[0x19];
    acStack_4e8[2] = local_5b0[0x1a];
    acStack_4e8[3] = local_5b0[0x1b];
    acStack_4e8[4] = local_5b0[0x1c];
    acStack_4e8[5] = local_5b0[0x1d];
    acStack_4e8[6] = local_5b0[0x1e];
    acStack_4e8[7] = local_5b0[0x1f];
  }
  else {
    local_500 = (char *)local_5b0._0_8_;
  }
  local_4f8 = (char *)local_5b0._8_8_;
  local_5b0._8_8_ = (char *)0x0;
  local_5b0[0x10] = '\0';
  local_c0.piece_._M_len = 7;
  local_c0.piece_._M_str = "_impl_.";
  local_f0 = 0xd;
  local_e8 = "_cached_size_";
  local_5b0._0_8_ = local_5b0 + 0x10;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_5d0,&local_c0);
  local_4d0 = local_4c0;
  local_4e0 = 0xb;
  local_4d8 = "cached_size";
  if ((undefined1 *)local_5d0._0_8_ == local_5d0 + 0x10) {
    acStack_4b8[0] = local_5d0[0x18];
    acStack_4b8[1] = local_5d0[0x19];
    acStack_4b8[2] = local_5d0[0x1a];
    acStack_4b8[3] = local_5d0[0x1b];
    acStack_4b8[4] = local_5d0[0x1c];
    acStack_4b8[5] = local_5d0[0x1d];
    acStack_4b8[6] = local_5d0[0x1e];
    acStack_4b8[7] = local_5d0[0x1f];
  }
  else {
    local_4d0 = (undefined1 *)local_5d0._0_8_;
  }
  local_4c8 = (char *)local_5d0._8_8_;
  local_5d0._8_8_ = (char *)0x0;
  local_5d0[0x10] = '\0';
  local_120.piece_._M_len = 7;
  local_120.piece_._M_str = "_impl_.";
  local_150 = 0xc;
  local_148 = "_extensions_";
  local_5d0._0_8_ = local_5d0 + 0x10;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_5f0,&local_120);
  local_4a0 = local_490;
  local_4b0 = 10;
  local_4a8 = "extensions";
  if ((undefined1 *)local_5f0._0_8_ == local_5f0 + 0x10) {
    acStack_488[0] = local_5f0[0x18];
    acStack_488[1] = local_5f0[0x19];
    acStack_488[2] = local_5f0[0x1a];
    acStack_488[3] = local_5f0[0x1b];
    acStack_488[4] = local_5f0[0x1c];
    acStack_488[5] = local_5f0[0x1d];
    acStack_488[6] = local_5f0[0x1e];
    acStack_488[7] = local_5f0[0x1f];
  }
  else {
    local_4a0 = (undefined1 *)local_5f0._0_8_;
  }
  local_498 = (char *)local_5f0._8_8_;
  local_5f0._8_8_ = (char *)0x0;
  local_5f0[0x10] = '\0';
  local_180.piece_._M_len = 7;
  local_180.piece_._M_str = "_impl_.";
  local_1b0 = 10;
  local_1a8 = "_has_bits_";
  local_5f0._0_8_ = local_5f0 + 0x10;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_610,&local_180);
  local_470 = local_460;
  local_480 = 8;
  local_478 = "has_bits";
  if ((undefined1 *)local_610._0_8_ == local_610 + 0x10) {
    acStack_458[0] = local_610[0x18];
    acStack_458[1] = local_610[0x19];
    acStack_458[2] = local_610[0x1a];
    acStack_458[3] = local_610[0x1b];
    acStack_458[4] = local_610[0x1c];
    acStack_458[5] = local_610[0x1d];
    acStack_458[6] = local_610[0x1e];
    acStack_458[7] = local_610[0x1f];
  }
  else {
    local_470 = (undefined1 *)local_610._0_8_;
  }
  local_468 = (char *)local_610._8_8_;
  local_610._8_8_ = (char *)0x0;
  local_610[0x10] = '\0';
  local_1e0.piece_._M_len = 7;
  local_1e0.piece_._M_str = "_impl_.";
  local_210 = 0x18;
  local_208 = "_inlined_string_donated_";
  local_610._0_8_ = local_610 + 0x10;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_530,&local_1e0);
  local_440 = local_430;
  local_450 = 0x1c;
  local_448 = "inlined_string_donated_array";
  puVar1 = local_530 + 0x10;
  if ((undefined1 *)local_530._0_8_ == puVar1) {
    acStack_428[0] = local_530[0x18];
    acStack_428[1] = local_530[0x19];
    acStack_428[2] = local_530[0x1a];
    acStack_428[3] = local_530[0x1b];
    acStack_428[4] = local_530[0x1c];
    acStack_428[5] = local_530[0x1d];
    acStack_428[6] = local_530[0x1e];
    acStack_428[7] = local_530[0x1f];
  }
  else {
    local_440 = (undefined1 *)local_530._0_8_;
  }
  local_438 = (char *)local_530._8_8_;
  local_530._8_8_ = (char *)0x0;
  local_530[0x10] = '\0';
  local_240.piece_._M_len = 7;
  local_240.piece_._M_str = "_impl_.";
  local_270 = 0xc;
  local_268 = "_oneof_case_";
  local_530._0_8_ = puVar1;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_550,&local_240);
  local_410 = local_400;
  local_420 = 10;
  local_418 = "oneof_case";
  puVar2 = local_550 + 0x10;
  if ((undefined1 *)local_550._0_8_ == puVar2) {
    acStack_3f8[0] = local_550[0x18];
    acStack_3f8[1] = local_550[0x19];
    acStack_3f8[2] = local_550[0x1a];
    acStack_3f8[3] = local_550[0x1b];
    acStack_3f8[4] = local_550[0x1c];
    acStack_3f8[5] = local_550[0x1d];
    acStack_3f8[6] = local_550[0x1e];
    acStack_3f8[7] = local_550[0x1f];
  }
  else {
    local_410 = (undefined1 *)local_550._0_8_;
  }
  local_408 = (char *)local_550._8_8_;
  local_550._8_8_ = (char *)0x0;
  local_550[0x10] = '\0';
  local_550._0_8_ = puVar2;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char_(&)[17],_true>
            (&local_3f0,(char (*) [8])"tracker",(char (*) [17])"Impl_::_tracker_");
  local_2a0.piece_._M_len = 7;
  local_2a0.piece_._M_str = "_impl_.";
  local_2d0 = 0x10;
  local_2c8 = "_weak_field_map_";
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_570,&local_2a0);
  local_3b0 = local_3a0;
  local_3c0 = 0xe;
  local_3b8 = "weak_field_map";
  puVar3 = local_570 + 0x10;
  if ((undefined1 *)local_570._0_8_ == puVar3) {
    acStack_398[0] = local_570[0x18];
    acStack_398[1] = local_570[0x19];
    acStack_398[2] = local_570[0x1a];
    acStack_398[3] = local_570[0x1b];
    acStack_398[4] = local_570[0x1c];
    acStack_398[5] = local_570[0x1d];
    acStack_398[6] = local_570[0x1e];
    acStack_398[7] = local_570[0x1f];
  }
  else {
    local_3b0 = (undefined1 *)local_570._0_8_;
  }
  local_3a8 = (char *)local_570._8_8_;
  local_570._8_8_ = (char *)0x0;
  local_570[0x10] = '\0';
  local_300.piece_._M_len = 7;
  local_300.piece_._M_str = "_impl_.";
  local_330.first._M_len = 7;
  local_330.first._M_str = "_split_";
  local_570._0_8_ = puVar3;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_590,&local_300);
  local_380 = local_370;
  local_390 = 5;
  local_388 = "split";
  puVar4 = local_590 + 0x10;
  if ((undefined1 *)local_590._0_8_ == puVar4) {
    acStack_368[0] = local_590[0x18];
    acStack_368[1] = local_590[0x19];
    acStack_368[2] = local_590[0x1a];
    acStack_368[3] = local_590[0x1b];
    acStack_368[4] = local_590[0x1c];
    acStack_368[5] = local_590[0x1d];
    acStack_368[6] = local_590[0x1e];
    acStack_368[7] = local_590[0x1f];
  }
  else {
    local_380 = (undefined1 *)local_590._0_8_;
  }
  local_378 = (char *)local_590._8_8_;
  local_590._8_8_ = (char *)0x0;
  local_590[0x10] = '\0';
  local_590._0_8_ = puVar4;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[17],_const_char_(&)[17],_true>
            (&local_360,(char (*) [17])"cached_split_ptr",(char (*) [17])"cached_split_ptr");
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::
  raw_hash_set<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>const*>
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(local_530 + 0x20),&local_330,0,&local_611,&local_612,&local_613);
  lVar5 = -0x1e0;
  paVar6 = &local_360.second.field_2;
  do {
    if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar6->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar6->_M_allocated_capacity)[-2],paVar6->_M_allocated_capacity + 1
                     );
    }
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar6->_M_allocated_capacity + -6);
    lVar5 = lVar5 + 0x30;
  } while (lVar5 != 0);
  if ((undefined1 *)local_590._0_8_ != puVar4) {
    operator_delete((void *)local_590._0_8_,CONCAT71(local_590._17_7_,local_590[0x10]) + 1);
  }
  if ((undefined1 *)local_570._0_8_ != puVar3) {
    operator_delete((void *)local_570._0_8_,CONCAT71(local_570._17_7_,local_570[0x10]) + 1);
  }
  if ((undefined1 *)local_550._0_8_ != puVar2) {
    operator_delete((void *)local_550._0_8_,CONCAT71(local_550._17_7_,local_550[0x10]) + 1);
  }
  if ((undefined1 *)local_530._0_8_ != puVar1) {
    operator_delete((void *)local_530._0_8_,CONCAT71(local_530._17_7_,local_530[0x10]) + 1);
  }
  if ((undefined1 *)local_610._0_8_ != local_610 + 0x10) {
    operator_delete((void *)local_610._0_8_,CONCAT71(local_610._17_7_,local_610[0x10]) + 1);
  }
  if ((undefined1 *)local_5f0._0_8_ != local_5f0 + 0x10) {
    operator_delete((void *)local_5f0._0_8_,CONCAT71(local_5f0._17_7_,local_5f0[0x10]) + 1);
  }
  if ((undefined1 *)local_5d0._0_8_ != local_5d0 + 0x10) {
    operator_delete((void *)local_5d0._0_8_,CONCAT71(local_5d0._17_7_,local_5d0[0x10]) + 1);
  }
  if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
    operator_delete((void *)local_5b0._0_8_,CONCAT71(local_5b0._17_7_,local_5b0[0x10]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

absl::flat_hash_map<absl::string_view, std::string> MessageVars(
    const Descriptor* desc) {
  absl::string_view prefix = "_impl_.";
  return {
      {"any_metadata", absl::StrCat(prefix, "_any_metadata_")},
      {"cached_size", absl::StrCat(prefix, "_cached_size_")},
      {"extensions", absl::StrCat(prefix, "_extensions_")},
      {"has_bits", absl::StrCat(prefix, "_has_bits_")},
      {"inlined_string_donated_array",
       absl::StrCat(prefix, "_inlined_string_donated_")},
      {"oneof_case", absl::StrCat(prefix, "_oneof_case_")},
      {"tracker", "Impl_::_tracker_"},
      {"weak_field_map", absl::StrCat(prefix, "_weak_field_map_")},
      {"split", absl::StrCat(prefix, "_split_")},
      {"cached_split_ptr", "cached_split_ptr"},
  };
}